

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

uchar * unbase64(char *ascii,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int B_2;
  int A_2;
  int C_1;
  int B_1;
  int A_1;
  int D;
  int C;
  int B;
  int A;
  int pad;
  int charNo;
  int cb;
  uchar *bin;
  uchar *safeAsciiPtr;
  int *flen_local;
  int len_local;
  char *ascii_local;
  
  pad = 0;
  if (len < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
    *flen = 0;
    ascii_local = (char *)0x0;
  }
  else {
    B = (int)(ascii[len + -1] == '=');
    if (ascii[len + -2] == '=') {
      B = B + 1;
    }
    *flen = (len * 3) / 4 - B;
    ascii_local = (char *)malloc((long)*flen);
    if (ascii_local == (char *)0x0) {
      puts("ERROR: unbase64 could not allocate enough memory.");
      puts("I must stop because I could not get enough");
      ascii_local = (char *)0x0;
    }
    else {
      for (A = 0; A <= (len + -4) - B; A = A + 4) {
        bVar1 = ""[(byte)ascii[A + 1]];
        bVar2 = ""[(byte)ascii[A + 2]];
        bVar3 = ""[(byte)ascii[A + 3]];
        ascii_local[pad] = ""[(byte)ascii[A]] << 2 | (byte)((int)(uint)bVar1 >> 4);
        iVar4 = pad + 2;
        ascii_local[pad + 1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
        pad = pad + 3;
        ascii_local[iVar4] = bVar2 << 6 | bVar3;
      }
      if (B == 1) {
        bVar1 = ""[(byte)ascii[A + 1]];
        bVar2 = ""[(byte)ascii[A + 2]];
        ascii_local[pad] = ""[(byte)ascii[A]] << 2 | (byte)((int)(uint)bVar1 >> 4);
        ascii_local[pad + 1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
      }
      else if (B == 2) {
        ascii_local[pad] = ""[(byte)ascii[A]] << 2 | (byte)((int)(uint)""[(byte)ascii[A + 1]] >> 4);
      }
    }
  }
  return (uchar *)ascii_local;
}

Assistant:

unsigned char* unbase64(const char* ascii, int len, int *flen) {
	const unsigned char *safeAsciiPtr = (const unsigned char*) ascii;
	unsigned char *bin;
	int cb = 0;
	int charNo;
	int pad = 0;

	if (len < 2) { // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts(
				"ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		*flen = 0;
		return 0;
	}
	if (safeAsciiPtr[len - 1] == '=')
		++pad;
	if (safeAsciiPtr[len - 2] == '=')
		++pad;

	*flen = 3 * len / 4 - pad;
	bin = (unsigned char*) malloc(*flen);
	if (!bin) {
		puts("ERROR: unbase64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
		bin[cb++] = (C << 6) | (D);
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];

		bin[cb++] = (A << 2) | (B >> 4);
	}

	return bin;
}